

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol(TIntermediate *this,TIntermSymbol *intermSymbol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TConstUnionArray *constArray;
  TIntermTyped *constSubtree;
  undefined4 extraout_var_03;
  TIntermSymbol *pTVar6;
  TIntermSymbol *intermSymbol_local;
  TIntermediate *this_local;
  
  iVar1 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  iVar2 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
  iVar3 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
  iVar4 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  constArray = TIntermSymbol::getConstArray(intermSymbol);
  constSubtree = TIntermSymbol::getConstSubtree(intermSymbol);
  iVar5 = (**(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
  pTVar6 = addSymbol(this,CONCAT44(extraout_var,iVar1),(TString *)CONCAT44(extraout_var_00,iVar2),
                     (TString *)CONCAT44(extraout_var_01,iVar3),
                     (TType *)CONCAT44(extraout_var_02,iVar4),constArray,constSubtree,
                     (TSourceLoc *)CONCAT44(extraout_var_03,iVar5));
  return pTVar6;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(const TIntermSymbol& intermSymbol)
{
    return addSymbol(intermSymbol.getId(),
                     intermSymbol.getName(),
                     intermSymbol.getMangledName(),
                     intermSymbol.getType(),
                     intermSymbol.getConstArray(),
                     intermSymbol.getConstSubtree(),
                     intermSymbol.getLoc());
}